

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_light_object::load(xr_light_object *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  fvector3 *pfVar6;
  float fVar7;
  undefined1 local_84 [8];
  d3d_light light;
  uint16_t version;
  xr_reader *r_local;
  xr_light_object *this_local;
  
  unique0x10000603 = r;
  sVar5 = xr_reader::r_chunk<unsigned_short>(r,0xb411,(unsigned_short *)((long)&light.theta + 2));
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x24,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  if (light.theta._2_2_ != 0x10 && light.theta._2_2_ != 0x11) {
    __assert_fail("version == LIGHT_VERSION_16 || version == LIGHT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x25,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,stack0xffffffffffffffe8);
  sVar5 = xr_reader::find_chunk(stack0xffffffffffffffe8,0xb442);
  if (sVar5 == 0) {
    sVar5 = xr_reader::find_chunk(stack0xffffffffffffffe8,0xb435);
    if (sVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0x41,"virtual void xray_re::xr_light_object::load(xr_reader &)");
    }
    d3d_light::load((d3d_light *)local_84,stack0xffffffffffffffe8);
    *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = local_84._0_4_;
    (this->m_color).r = (float)local_84._4_4_;
    (this->m_color).g = (float)light.type;
    (this->m_color).b = light.diffuse.r;
    (this->m_color).a = light.diffuse.g;
    pfVar6 = xr_custom_object::co_position(&this->super_xr_custom_object);
    _vector3<float>::set<float>(pfVar6,(_vector3<float> *)&light.ambient.b);
    this->m_range = light.direction.field_0.field_0.y;
    this->m_attenuation_constant = light.range;
    this->m_attenuation_linear = light.falloff;
    this->m_attenuation_quadratic = light.attenuation0;
    this->m_cone_angle = light.attenuation2;
    xr_reader::debug_find_chunk(stack0xffffffffffffffe8);
    sVar5 = xr_reader::r_chunk<float>(stack0xffffffffffffffe8,0xb425,&this->m_brightness);
    if (sVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0x3f,"virtual void xray_re::xr_light_object::load(xr_reader &)");
    }
  }
  else {
    uVar4 = xr_reader::r_u32(stack0xffffffffffffffe8);
    *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = uVar4;
    xr_reader::r<xray_re::_color<float>>(stack0xffffffffffffffe8,&this->m_color);
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_brightness = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_range = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_attenuation_constant = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_attenuation_linear = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_attenuation_quadratic = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_cone_angle = fVar7;
    fVar7 = xr_reader::r_float(stack0xffffffffffffffe8);
    this->m_unknown = fVar7;
    xr_reader::debug_find_chunk(stack0xffffffffffffffe8);
  }
  sVar5 = xr_reader::r_chunk<unsigned_int>(stack0xffffffffffffffe8,0xb436,&this->m_use_in_d3d);
  pxVar1 = stack0xffffffffffffffe8;
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0x44,"virtual void xray_re::xr_light_object::load(xr_reader &)");
  }
  if (light.theta._2_2_ == 0x10) {
    pfVar6 = xr_custom_object::co_rotation(&this->super_xr_custom_object);
    sVar5 = xr_reader::r_chunk<xray_re::_vector3<float>>(pxVar1,0xb437,pfVar6);
    if (sVar5 == 0) {
      pfVar6 = xr_custom_object::co_rotation(&this->super_xr_custom_object);
      _vector3<float>::set(pfVar6,0.0,0.0,0.0);
    }
  }
  xr_reader::r_chunk<unsigned_int>(stack0xffffffffffffffe8,0xb413,&this->m_flags);
  xr_reader::r_chunk<unsigned_int>(stack0xffffffffffffffe8,0xb441,&this->m_control);
  if (*(int *)&(this->super_xr_custom_object).field_0x6c != 3) {
    sVar5 = xr_reader::find_chunk(stack0xffffffffffffffe8,0xb438);
    if (sVar5 != 0) {
      xr_reader::r_sz(stack0xffffffffffffffe8,&this->m_animation);
      xr_reader::debug_find_chunk(stack0xffffffffffffffe8);
    }
    sVar5 = xr_reader::find_chunk(stack0xffffffffffffffe8,0xb439);
    if (sVar5 != 0) {
      xr_reader::r_sz(stack0xffffffffffffffe8,&this->m_texture);
      xr_reader::debug_find_chunk(stack0xffffffffffffffe8);
    }
    sVar5 = xr_reader::find_chunk(stack0xffffffffffffffe8,0xb440);
    if (sVar5 == 0) {
      this->m_flags = this->m_flags & 0xffffffef;
    }
    else {
      uVar2 = xr_reader::r_u8(stack0xffffffffffffffe8);
      (this->m_shape).type = uVar2;
      xr_reader::r<xray_re::_vector4<float>>(stack0xffffffffffffffe8,&(this->m_shape).fixme);
      pxVar1 = stack0xffffffffffffffe8;
      uVar3 = xr_reader::r_u16(stack0xffffffffffffffe8);
      xr_reader::
      r_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
                (pxVar1,(ulong)uVar3,&this->m_vertices);
      xr_reader::debug_find_chunk(stack0xffffffffffffffe8);
      this->m_flags = this->m_flags | 0x10;
    }
    return;
  }
  __assert_fail("m_type != D3D_LIGHT_DIRECTIONAL",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                ,0x4b,"virtual void xray_re::xr_light_object::load(xr_reader &)");
}

Assistant:

void xr_light_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(LIGHT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == LIGHT_VERSION_16 || version == LIGHT_VERSION);
	xr_custom_object::load(r);
	if (r.find_chunk(LIGHT_CHUNK_PARAMS)) {
		m_type = r.r_u32();
		r.r<fcolor>(m_color);
		m_brightness = r.r_float();
		m_range = r.r_float();
		m_attenuation_constant = r.r_float();
		m_attenuation_linear = r.r_float();
		m_attenuation_quadratic = r.r_float();
		m_cone_angle = r.r_float();
		m_unknown = r.r_float();
		r.debug_find_chunk();
	} else if (r.find_chunk(LIGHT_CHUNK_D3D_PARAMS)) {
		d3d_light light;
		light.load(r);
		m_type = light.type;
		m_color = light.diffuse;
		co_position().set(light.position);
		m_range = light.range;
		m_attenuation_constant = light.attenuation0;
		m_attenuation_linear = light.attenuation1;
		m_attenuation_quadratic = light.attenuation2;
		m_cone_angle = light.phi;
		r.debug_find_chunk();
		if (!r.r_chunk<float>(LIGHT_CHUNK_BRIGHTNESS, m_brightness))
			xr_not_expected();
	} else {
		xr_not_expected();
	}
	if (!r.r_chunk<uint32_t>(LIGHT_CHUNK_USE_IN_D3D, m_use_in_d3d))
		xr_not_expected();
	if (version == LIGHT_VERSION_16 &&
			!r.r_chunk<fvector3>(LIGHT_CHUNK_ROTATION, co_rotation())) {
		co_rotation().set();
	}
	r.r_chunk<uint32_t>(LIGHT_CHUNK_FLAGS, m_flags);
	r.r_chunk<uint32_t>(LIGHT_CHUNK_CONTROL, m_control);
	xr_assert(m_type != D3D_LIGHT_DIRECTIONAL);	// FIXME
	if (r.find_chunk(LIGHT_CHUNK_ANIMATION)) {
		r.r_sz(m_animation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_FUZZY_DATA)) {
		m_shape.type = r.r_u8();
		r.r<fvector4>(m_shape.fixme);
		r.r_seq(r.r_u16(), m_vertices);
		r.debug_find_chunk();
		m_flags |= LIGHT_FLAG_FUZZY;
	} else {
		m_flags &= ~LIGHT_FLAG_FUZZY;
	}
}